

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O2

MPP_RET mpp_node_task_detach(MppNodeTask *task)

{
  MppNodeImpl *pMVar1;
  char *pcVar2;
  MppNodeProc *pMVar3;
  undefined8 in_RAX;
  undefined8 uVar4;
  undefined4 uVar5;
  
  uVar5 = (undefined4)((ulong)in_RAX >> 0x20);
  pMVar1 = task->node;
  if (pMVar1->attached != 0) {
    pcVar2 = task->node_name;
    pMVar3 = task->proc;
    LOCK();
    pMVar1->state = pMVar1->state & 0xfffffffe;
    UNLOCK();
    mpp_node_task_schedule_f("mpp_node_task_detach",task);
    if (((byte)mpp_cluster_debug & 1) != 0) {
      uVar4 = CONCAT44(uVar5,pMVar3->run_count);
      _mpp_log_l(4,"mpp_cluster","%s state %x:%d wait detach start\n",(char *)0x0,pcVar2,
                 (ulong)pMVar1->state,uVar4);
      uVar5 = (undefined4)((ulong)uVar4 >> 0x20);
    }
    sem_wait((sem_t *)&pMVar1->sem_detach);
    if (pMVar1->attached != 0) {
      uVar4 = CONCAT44(uVar5,0x133);
      _mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,"node->attached == 0",
                 "mpp_node_task_detach",uVar4);
      uVar5 = (undefined4)((ulong)uVar4 >> 0x20);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
    if (((byte)mpp_cluster_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_cluster","%s state %x:%d wait detach done\n",(char *)0x0,pcVar2,
                 (ulong)pMVar1->state,CONCAT44(uVar5,pMVar3->run_count));
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_node_task_detach(MppNodeTask *task)
{
    MppNodeImpl *node = task->node;
    MPP_RET ret = MPP_OK;

    if (node->attached) {
        const char *node_name = task->node_name;
        MppNodeProc *proc = task->proc;

        MPP_FETCH_AND(&node->state, ~NODE_VALID);

        mpp_node_task_schedule(task);

        cluster_dbg_flow("%s state %x:%d wait detach start\n",
                         node_name, node->state, proc->run_count);

        sem_wait(&node->sem_detach);
        mpp_assert(node->attached == 0);

        cluster_dbg_flow("%s state %x:%d wait detach done\n",
                         node_name, node->state, proc->run_count);
    }

    return ret;
}